

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool CLI::detail::split_short(string *current,string *name,string *rest)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  string *in_RDX;
  string *in_RSI;
  ulong in_RDI;
  string local_60 [32];
  string local_40 [32];
  string *local_20;
  string *local_18;
  ulong local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar2 = ::std::__cxx11::string::size();
  if ((1 < uVar2) && (pcVar3 = (char *)::std::__cxx11::string::operator[](local_10), *pcVar3 == '-')
     ) {
    pcVar3 = (char *)::std::__cxx11::string::operator[](local_10);
    bVar1 = valid_first_char<char>(*pcVar3);
    if (bVar1) {
      ::std::__cxx11::string::substr((ulong)local_40,local_10);
      ::std::__cxx11::string::operator=(local_18,local_40);
      ::std::__cxx11::string::~string(local_40);
      ::std::__cxx11::string::substr((ulong)local_60,local_10);
      ::std::__cxx11::string::operator=(local_20,local_60);
      ::std::__cxx11::string::~string(local_60);
      return true;
    }
  }
  return false;
}

Assistant:

CLI11_INLINE bool split_short(const std::string &current, std::string &name, std::string &rest) {
    if(current.size() > 1 && current[0] == '-' && valid_first_char(current[1])) {
        name = current.substr(1, 1);
        rest = current.substr(2);
        return true;
    }
    return false;
}